

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

TCGLabel * gen_new_label_mipsel(TCGContext_conflict4 *s)

{
  uint uVar1;
  TCGLabel *pTVar2;
  
  pTVar2 = (TCGLabel *)tcg_malloc(s,0x28);
  *(undefined8 *)pTVar2 = 0;
  (pTVar2->u).value = 0;
  (pTVar2->relocs).sqh_first = (TCGRelocation *)0x0;
  (pTVar2->relocs).sqh_last = (TCGRelocation **)0x0;
  (pTVar2->next).sqe_next = (TCGLabel *)0x0;
  uVar1 = s->nb_labels;
  s->nb_labels = uVar1 + 1;
  *(uint *)pTVar2 = (*(uint *)pTVar2 & 0xffff0003) + (uVar1 & 0x3fff) * 4;
  (pTVar2->relocs).sqh_last = &(pTVar2->relocs).sqh_first;
  *(s->labels).sqh_last = pTVar2;
  (s->labels).sqh_last = &(pTVar2->next).sqe_next;
  return pTVar2;
}

Assistant:

TCGLabel *gen_new_label(TCGContext *s)
{
    TCGLabel *l = tcg_malloc(s, sizeof(TCGLabel));

    memset(l, 0, sizeof(TCGLabel));
    l->id = s->nb_labels++;
    QSIMPLEQ_INIT(&l->relocs);

    QSIMPLEQ_INSERT_TAIL(&s->labels, l, next);

    return l;
}